

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O2

int libssh2_knownhost_readline(LIBSSH2_KNOWNHOSTS *hosts,char *line,size_t len,int type)

{
  byte *__s1;
  byte bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  byte *pbVar9;
  LIBSSH2_SESSION *pLVar10;
  long lVar11;
  byte *key;
  byte bVar12;
  size_t keylen;
  long lVar13;
  byte *pbVar14;
  byte *pbVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  byte *local_1a8;
  byte *local_198;
  size_t local_178;
  byte *local_170;
  char saltbuf [32];
  char local_138;
  undefined1 local_137 [263];
  
  if (type == 1) {
    lVar7 = -(long)line + -4;
    lVar8 = 0;
    while( true ) {
      if (len - lVar8 == 0) {
        return 0;
      }
      uVar18 = (ulong)(byte)line[lVar8];
      if (0x23 < uVar18) break;
      if ((0x100000200U >> (uVar18 & 0x3f) & 1) == 0) {
        if ((0x800000401U >> (uVar18 & 0x3f) & 1) != 0) {
          return 0;
        }
        break;
      }
      lVar7 = lVar7 + -1;
      lVar8 = lVar8 + 1;
    }
    __s1 = (byte *)(line + lVar8);
    lVar4 = len - lVar8;
    pbVar14 = __s1;
    while ((pbVar15 = (byte *)(line + len), lVar4 != 0 &&
           ((0x20 < (ulong)*pbVar14 ||
            (pbVar15 = pbVar14, (0x100000201U >> ((ulong)*pbVar14 & 0x3f) & 1) == 0))))) {
      pbVar14 = pbVar14 + 1;
      lVar4 = lVar4 + -1;
    }
    lVar16 = -lVar4;
    for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
      bVar1 = pbVar15[lVar5];
      if ((bVar1 != 9) && (bVar1 != 0x20)) {
        if (bVar1 != 0) {
          pbVar14 = pbVar15 + lVar5;
          lVar11 = 0;
          goto LAB_00119fcc;
        }
        break;
      }
      lVar16 = lVar16 + 1;
    }
    pLVar10 = hosts->session;
    pcVar6 = "Failed to parse known_hosts line";
  }
  else {
    pLVar10 = hosts->session;
    pcVar6 = "Unsupported type of known-host information store";
  }
LAB_00119efa:
  iVar2 = _libssh2_error(pLVar10,-0x21,pcVar6);
  return iVar2;
LAB_00119fcc:
  if (lVar4 - lVar5 == lVar11) goto LAB_00119fea;
  bVar12 = pbVar15[lVar5 + lVar11];
  if ((bVar12 == 0) || (bVar12 == 10)) goto LAB_00119fef;
  lVar11 = lVar11 + 1;
  goto LAB_00119fcc;
LAB_00119fea:
  bVar12 = pbVar15[lVar4];
LAB_00119fef:
  keylen = (lVar4 - (ulong)(bVar12 == 10)) - lVar5;
  if (keylen < 0x14) {
    pLVar10 = hosts->session;
    pcVar6 = "Failed to parse known_hosts line (key too short)";
    goto LAB_00119efa;
  }
  if ((byte)(bVar1 - 0x30) < 10) {
    uVar3 = 0x40000;
    local_170 = (byte *)0x0;
    local_1a8 = (byte *)0x0;
    local_178 = 0;
    local_198 = (byte *)0x0;
    key = pbVar14;
  }
  else {
    lVar13 = -(ulong)(bVar12 == 10);
    lVar11 = lVar13 + lVar4;
    pbVar9 = pbVar14;
    while ((key = pbVar15 + lVar11, lVar5 - lVar4 != lVar13 &&
           ((0x20 < (ulong)*pbVar9 ||
            (key = pbVar9, (0x100000201U >> ((ulong)*pbVar9 & 0x3f) & 1) == 0))))) {
      pbVar9 = pbVar9 + 1;
      lVar13 = lVar13 + -1;
    }
    local_198 = key + (-lVar5 - (long)pbVar15);
    iVar2 = strncmp((char *)pbVar14,"ssh-dss",(size_t)local_198);
    if (iVar2 == 0) {
      uVar3 = 0xc0000;
    }
    else {
      iVar2 = strncmp((char *)pbVar14,"ssh-rsa",(size_t)local_198);
      if (iVar2 == 0) {
        uVar3 = 0x80000;
      }
      else {
        iVar2 = strncmp((char *)pbVar14,"ecdsa-sha2-nistp256",(size_t)local_198);
        if (iVar2 == 0) {
          uVar3 = 0x100000;
        }
        else {
          iVar2 = strncmp((char *)pbVar14,"ecdsa-sha2-nistp384",(size_t)local_198);
          if (iVar2 == 0) {
            uVar3 = 0x140000;
          }
          else {
            iVar2 = strncmp((char *)pbVar14,"ecdsa-sha2-nistp521",(size_t)local_198);
            if (iVar2 == 0) {
              uVar3 = 0x180000;
            }
            else {
              iVar2 = strncmp((char *)pbVar14,"ssh-ed25519",(size_t)local_198);
              uVar3 = (uint)(iVar2 != 0) << 0x15 | 0x1c0000;
            }
          }
        }
      }
    }
    lVar16 = lVar16 - lVar13;
    for (; (*key == 9 || (*key == 0x20)); key = key + 1) {
      lVar16 = lVar16 + 1;
    }
    local_170 = (byte *)0x0;
    for (keylen = 0; -keylen != lVar16; keylen = keylen + 1) {
      if (((ulong)key[keylen] < 0x21) && ((0x100000201U >> ((ulong)key[keylen] & 0x3f) & 1) != 0)) {
        local_170 = key + keylen;
        break;
      }
    }
    pbVar9 = local_170 + (-lVar16 - keylen);
    local_178 = -(keylen + lVar16);
    while (local_1a8 = pbVar14, local_178 != 0) {
      if ((*local_170 != 0x20) && (*local_170 != 9)) goto LAB_0011a22c;
      local_170 = local_170 + 1;
      local_178 = local_178 - 1;
    }
    local_178 = 0;
    local_170 = pbVar9;
  }
LAB_0011a22c:
  if ((pbVar15 + (-lVar8 - (long)line) < (byte *)0x3) || (iVar2 = bcmp(__s1,"|1|",3), iVar2 == 0)) {
    pcVar6 = saltbuf + -(long)line + 0x1c + (long)pbVar15 + -lVar8;
    uVar18 = 0;
    while( true ) {
      if (line[lVar8 + 3 + uVar18] == '\0') {
        return 0;
      }
      if (line[lVar8 + 3 + uVar18] == '|') break;
      uVar18 = uVar18 + 1;
      pcVar6 = pcVar6 + -1;
    }
    if (0x1e < uVar18) {
      pLVar10 = hosts->session;
      pcVar6 = "Failed to parse known_hosts line (unexpectedly long salt)";
      goto LAB_0011a3be;
    }
    memcpy(saltbuf,line + lVar8 + 3,uVar18);
    saltbuf[uVar18] = '\0';
    if (pbVar15 + (lVar7 - uVar18) < (byte *)0xff) {
      memcpy(&local_138,line + lVar8 + uVar18 + 4,(size_t)(pbVar15 + (lVar7 - uVar18)));
      *pcVar6 = '\0';
      iVar2 = knownhost_add(hosts,&local_138,saltbuf,(char *)local_1a8,(size_t)local_198,(char *)key
                            ,keylen,(char *)local_170,local_178,uVar3 | 0x20002,
                            (libssh2_knownhost **)0x0);
      return iVar2;
    }
    pLVar10 = hosts->session;
  }
  else {
    pbVar14 = __s1 + (long)(pbVar15 + (-lVar8 - (long)line));
    uVar18 = 0;
    while( true ) {
      do {
        uVar17 = uVar18;
        pbVar15 = pbVar14;
        if (pbVar15 <= __s1) {
          return 0;
        }
        pbVar14 = pbVar15 + -1;
        uVar18 = uVar17 + 1;
      } while ((__s1 != pbVar14) && (pbVar15[-2] != 0x2c));
      if (0xfe < uVar18) break;
      memcpy(&local_138,pbVar14,uVar18);
      local_137[uVar17] = 0;
      iVar2 = knownhost_add(hosts,&local_138,(char *)0x0,(char *)local_1a8,(size_t)local_198,
                            (char *)key,keylen,(char *)local_170,local_178,uVar3 | 0x20001,
                            (libssh2_knownhost **)0x0);
      if (iVar2 != 0) {
        return iVar2;
      }
      if (__s1 < pbVar14) {
        pbVar14 = pbVar15 + -2;
        uVar18 = 0;
      }
    }
    pLVar10 = hosts->session;
  }
  pcVar6 = "Failed to parse known_hosts line (unexpected length)";
LAB_0011a3be:
  iVar2 = _libssh2_error(pLVar10,-0x21,pcVar6);
  return iVar2;
}

Assistant:

LIBSSH2_API int
libssh2_knownhost_readline(LIBSSH2_KNOWNHOSTS *hosts,
                           const char *line, size_t len, int type)
{
    const char *cp;
    const char *hostp;
    const char *keyp;
    size_t hostlen;
    size_t keylen;
    int rc;

    if(type != LIBSSH2_KNOWNHOST_FILE_OPENSSH)
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Unsupported type of known-host information "
                              "store");

    cp = line;

    /* skip leading whitespaces */
    while(len && ((*cp == ' ') || (*cp == '\t'))) {
        cp++;
        len--;
    }

    if(!len || !*cp || (*cp == '#') || (*cp == '\n'))
        /* comment or empty line */
        return LIBSSH2_ERROR_NONE;

    /* the host part starts here */
    hostp = cp;

    /* move over the host to the separator */
    while(len && *cp && (*cp != ' ') && (*cp != '\t')) {
        cp++;
        len--;
    }

    hostlen = cp - hostp;

    /* the key starts after the whitespaces */
    while(len && *cp && ((*cp == ' ') || (*cp == '\t'))) {
        cp++;
        len--;
    }

    if(!*cp || !len) /* illegal line */
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Failed to parse known_hosts line");

    keyp = cp; /* the key starts here */
    keylen = len;

    /* check if the line (key) ends with a newline and if so kill it */
    while(len && *cp && (*cp != '\n')) {
        cp++;
        len--;
    }

    /* zero terminate where the newline is */
    if(*cp == '\n')
        keylen--; /* don't include this in the count */

    /* deal with this one host+key line */
    rc = hostline(hosts, hostp, hostlen, keyp, keylen);
    if(rc)
        return rc; /* failed */

    return LIBSSH2_ERROR_NONE; /* success */
}